

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_insert(DisasContext_conflict14 *ctx,TCGv_i32 ret,TCGv_i32 r1,TCGv_i32 r2,TCGv_i32 width,
               TCGv_i32 pos)

{
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  uintptr_t o;
  TCGv_i32 ret_00;
  uintptr_t o_1;
  
  ts = tcg_temp_new_internal_tricore((TCGContext_conflict9 *)ctx,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)ts - (long)ctx);
  ts_00 = tcg_temp_new_internal_tricore((TCGContext_conflict9 *)ctx,TCG_TYPE_I32,false);
  ts_01 = tcg_temp_new_internal_tricore((TCGContext_conflict9 *)ctx,TCG_TYPE_I32,false);
  tcg_gen_op2_tricore((TCGContext_conflict9 *)ctx,INDEX_op_movi_i32,(TCGArg)ts,1);
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_shl_i32,(TCGArg)ts,(TCGArg)ts,
                      (TCGArg)(width + (long)ctx));
  tcg_gen_subi_i32_tricore((TCGContext_conflict9 *)ctx,ret_00,ret_00,1);
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_shl_i32,(TCGArg)ts,(TCGArg)ts,
                      (TCGArg)(pos + (long)ctx));
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_shl_i32,(TCGArg)ts_00,
                      (TCGArg)(r2 + (long)ctx),(TCGArg)(pos + (long)ctx));
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_and_i32,(TCGArg)ts_00,(TCGArg)ts_00,
                      (TCGArg)ts);
  tcg_gen_andc_i32_tricore
            ((TCGContext_conflict9 *)ctx,(TCGv_i32)((long)ts_01 - (long)ctx),r1,ret_00);
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_or_i32,(TCGArg)(ret + (long)ctx),
                      (TCGArg)ts_00,(TCGArg)ts_01);
  tcg_temp_free_internal_tricore((TCGContext_conflict9 *)ctx,ts);
  tcg_temp_free_internal_tricore((TCGContext_conflict9 *)ctx,ts_00);
  tcg_temp_free_internal_tricore((TCGContext_conflict9 *)ctx,ts_01);
  return;
}

Assistant:

static inline void gen_insert(DisasContext *ctx, TCGv ret, TCGv r1, TCGv r2, TCGv width, TCGv pos)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv mask = tcg_temp_new(tcg_ctx);
    TCGv temp = tcg_temp_new(tcg_ctx);
    TCGv temp2 = tcg_temp_new(tcg_ctx);

    tcg_gen_movi_tl(tcg_ctx, mask, 1);
    tcg_gen_shl_tl(tcg_ctx, mask, mask, width);
    tcg_gen_subi_tl(tcg_ctx, mask, mask, 1);
    tcg_gen_shl_tl(tcg_ctx, mask, mask, pos);

    tcg_gen_shl_tl(tcg_ctx, temp, r2, pos);
    tcg_gen_and_tl(tcg_ctx, temp, temp, mask);
    tcg_gen_andc_tl(tcg_ctx, temp2, r1, mask);
    tcg_gen_or_tl(tcg_ctx, ret, temp, temp2);

    tcg_temp_free(tcg_ctx, mask);
    tcg_temp_free(tcg_ctx, temp);
    tcg_temp_free(tcg_ctx, temp2);
}